

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O0

void __thiscall testbench::anon_unknown_0::destroyer::~destroyer(destroyer *this)

{
  machines_container *pmVar1;
  destroyer *this_local;
  
  pmVar1 = (anonymous_namespace)::machines;
  if (((anonymous_namespace)::machines != (machines_container *)0x0) &&
     ((anonymous_namespace)::machines != (machines_container *)0x0)) {
    machines_container::~machines_container((anonymous_namespace)::machines);
    operator_delete(pmVar1,0x30);
  }
  return;
}

Assistant:

~destroyer()
    {
        if (machines != nullptr) {
            delete machines;
        }
    }